

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
kratos::Generator::add_function(Generator *this,shared_ptr<kratos::FunctionStmtBlock> *func)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  *this_00;
  element_type *peVar1;
  pointer pcVar2;
  iterator iVar3;
  StmtException *this_01;
  mapped_type *pmVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_bool>
  pVar5;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  element_type *local_a8;
  element_type *local_a0;
  string local_98;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_78;
  size_type sStack_60;
  undefined1 auStack_58 [8];
  string func_name;
  
  peVar1 = (func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar2 = (peVar1->function_name_)._M_dataplus._M_p;
  auStack_58 = (undefined1  [8])&func_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_58,pcVar2,pcVar2 + (peVar1->function_name_)._M_string_length);
  this_00 = &this->funcs_;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::find(&this_00->_M_t,(key_type *)auStack_58);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->funcs_)._M_t._M_impl.super__Rb_tree_header) {
    local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78.
                           super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)(this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<unsigned_int,std::__cxx11::string&>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                *)&this->func_index_,(uint *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58);
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
            ::
            _M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::FunctionStmtBlock>const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_58,func);
    peVar1 = (func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this,pVar5._8_8_);
    if (auStack_58 != (undefined1  [8])&func_name._M_string_length) {
      operator_delete((void *)auStack_58,func_name._M_string_length + 1);
    }
    return;
  }
  this_01 = (StmtException *)__cxa_allocate_exception(0x10);
  local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->instance_name)._M_dataplus._M_p;
  sStack_60 = (this->instance_name)._M_string_length;
  local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_58;
  local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)func_name._M_dataplus._M_p;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x22;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_98,(detail *)"Function {0} already exists in {1}",format_str,args);
  local_a8 = (func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
           ::at(this_00,(key_type *)auStack_58);
  local_a0 = (pmVar4->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a8;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_78,__l,(allocator_type *)(func_name.field_2._M_local_buf + 0xf));
  StmtException::StmtException(this_01,&local_98,&local_78);
  __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::add_function(const std::shared_ptr<FunctionStmtBlock> &func) {
    auto func_name = func->function_name();
    if (funcs_.find(func_name) != funcs_.end())
        throw StmtException(
            ::format("Function {0} already exists in {1}", func_name, instance_name),
            {func.get(), funcs_.at(func_name).get()});
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, func);
    // change the parent
    func->set_parent(this);
}